

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# die.h
# Opt level: O0

int __thiscall ORPG::Die::roll(Die *this)

{
  result_type_conflict1 rVar1;
  uint uVar2;
  result_type ret;
  uniform_int_distribution<int> dist;
  undefined1 local_2720 [8];
  mt19937 mt;
  random_device rd;
  Die *this_local;
  
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar1 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&stack0xffffffffffffd8cc,1,this->_MAX);
  uVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&stack0xffffffffffffd8cc,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_2720);
  if (((byte)Core::VB_FLAG & 1) != 0) {
    printf("d%i -> %i\n",(ulong)(uint)this->_MAX,(ulong)uVar2);
  }
  std::random_device::~random_device((random_device *)&mt._M_p);
  return uVar2;
}

Assistant:

int roll() {
                std::random_device rd;
                std::mt19937 mt(rd());
                std::uniform_int_distribution<int> dist(1, _MAX);

                auto ret = dist(mt);

                /* verbosely prints die rolls in the form "dX -> N" */
                if(Core::VB_FLAG) printf("d%i -> %i\n", _MAX, ret);

                return ret;
            }